

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O2

void duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  UnifiedVectorFormat *count;
  double *pdVar3;
  list_entry_t *plVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  anon_class_24_3_3d016869 fun;
  anon_class_24_3_3d016869 fun_00;
  anon_class_24_3_3d016869 fun_01;
  anon_class_24_3_3d016869 fun_02;
  anon_class_24_3_3d016869 fun_03;
  anon_class_24_3_3d016869 fun_04;
  anon_class_24_3_3d016869 fun_05;
  anon_class_24_3_3d016869 fun_06;
  anon_class_24_3_3d016869 fun_07;
  anon_class_24_3_3d016869 fun_08;
  anon_class_24_3_3d016869 fun_09;
  anon_class_24_3_3d016869 fun_10;
  bool bVar8;
  char cVar9;
  BoundFunctionExpression *pBVar10;
  string *psVar11;
  reference vector;
  reference vector_00;
  idx_t count_00;
  idx_t count_01;
  Vector *vector_01;
  Vector *vector_02;
  UnifiedVectorFormat *pUVar12;
  InvalidInputException *pIVar13;
  ulong uVar14;
  UnifiedVectorFormat *pUVar15;
  idx_t i_2;
  ulong uVar16;
  long lVar17;
  uint64_t *puVar18;
  VectorType VVar19;
  idx_t i;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  UnifiedVectorFormat *pUVar23;
  TemplatedValidityMask<unsigned_long> *pTVar24;
  list_entry_t right;
  list_entry_t right_00;
  list_entry_t right_01;
  list_entry_t right_02;
  list_entry_t right_03;
  list_entry_t right_04;
  list_entry_t right_05;
  list_entry_t right_06;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  list_entry_t left_06;
  UnifiedVectorFormat ldata;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100 [3];
  long *local_c8;
  long local_c0;
  long local_b8;
  double *rhs_data;
  double *lhs_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pBVar10 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  psVar11 = (string *)(pBVar10 + 0x60);
  count = *(UnifiedVectorFormat **)(args + 0x18);
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  count_00 = duckdb::ListVector::GetListSize(vector);
  count_01 = duckdb::ListVector::GetListSize(vector_00);
  vector_01 = (Vector *)duckdb::ListVector::GetEntry(vector);
  vector_02 = (Vector *)duckdb::ListVector::GetEntry(vector_00);
  duckdb::Vector::Flatten((ulong)vector_01);
  duckdb::Vector::Flatten((ulong)vector_02);
  FlatVector::VerifyFlatVector(vector_01);
  bVar8 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                    ((TemplatedValidityMask<unsigned_long> *)(vector_01 + 0x28),count_00);
  if (!bVar8) {
    pIVar13 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&ldata,"%s: left argument can not contain NULL values",
               (allocator *)&local_c8);
    std::__cxx11::string::string((string *)&local_50,psVar11);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar13,(string *)&ldata,&local_50);
    __cxa_throw(pIVar13,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  FlatVector::VerifyFlatVector(vector_02);
  bVar8 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                    ((TemplatedValidityMask<unsigned_long> *)(vector_02 + 0x28),count_01);
  if (!bVar8) {
    pIVar13 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&ldata,"%s: right argument can not contain NULL values",
               (allocator *)&local_c8);
    std::__cxx11::string::string((string *)&local_70,psVar11);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar13,(string *)&ldata,&local_70);
    __cxa_throw(pIVar13,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  lhs_data = *(double **)(vector_01 + 0x20);
  rhs_data = *(double **)(vector_02 + 0x20);
  vVar1 = *vector;
  vVar2 = *vector_00;
  VVar19 = (VectorType)result;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar19);
    pdVar3 = *(double **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      fun.lhs_data = &lhs_data;
      fun.func_name = (string *)psVar11;
      fun.rhs_data = &rhs_data;
      dVar7 = BinaryLambdaWrapperWithNulls::
              Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                        (fun,**(list_entry_t **)(vector + 0x20),
                         **(list_entry_t **)(vector_00 + 0x20),(ValidityMask *)(result + 0x28),0);
      *pdVar3 = dVar7;
      goto LAB_0072bb72;
    }
  }
  else if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
    lVar17 = *(long *)(vector + 0x20);
    plVar4 = *(list_entry_t **)(vector_00 + 0x20);
    if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) || ((**(byte **)(vector_00 + 0x28) & 1) != 0))
    {
      duckdb::Vector::SetVectorType(VVar19);
      lVar5 = *(long *)(result + 0x20);
      FlatVector::VerifyFlatVector(result);
      pTVar24 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
      FlatVector::VerifyFlatVector(vector);
      TemplatedValidityMask<unsigned_long>::Copy
                (pTVar24,(TemplatedValidityMask<unsigned_long> *)(vector + 0x28),(idx_t)count);
      if (*(long *)(result + 0x28) == 0) {
        puVar18 = (uint64_t *)(lVar17 + 8);
        for (pUVar23 = (UnifiedVectorFormat *)0x0; count != pUVar23; pUVar23 = pUVar23 + 1) {
          fun_05.lhs_data = &lhs_data;
          fun_05.func_name = (string *)psVar11;
          fun_05.rhs_data = &rhs_data;
          left_02.length = *puVar18;
          left_02.offset = puVar18[-1];
          dVar7 = BinaryLambdaWrapperWithNulls::
                  Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                            (fun_05,left_02,*plVar4,(ValidityMask *)pTVar24,(idx_t)pUVar23);
          *(double *)(lVar5 + (long)pUVar23 * 8) = dVar7;
          puVar18 = puVar18 + 2;
        }
      }
      else {
        lVar17 = lVar17 + 8;
        pUVar23 = (UnifiedVectorFormat *)0x0;
        for (uVar14 = 0; uVar14 != (ulong)(count + 0x3f) >> 6; uVar14 = uVar14 + 1) {
          if (pTVar24->validity_mask == (unsigned_long *)0x0) {
            pUVar12 = pUVar23 + 0x40;
            if (count <= pUVar23 + 0x40) {
              pUVar12 = count;
            }
LAB_0072b619:
            puVar18 = (uint64_t *)((long)pUVar23 * 0x10 + lVar17);
            for (; pUVar15 = pUVar23, pUVar23 < pUVar12; pUVar23 = pUVar23 + 1) {
              fun_00.lhs_data = &lhs_data;
              fun_00.func_name = (string *)psVar11;
              fun_00.rhs_data = &rhs_data;
              left.length = *puVar18;
              left.offset = puVar18[-1];
              dVar7 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                (fun_00,left,*plVar4,(ValidityMask *)pTVar24,(idx_t)pUVar23);
              *(double *)(lVar5 + (long)pUVar23 * 8) = dVar7;
              puVar18 = puVar18 + 2;
            }
          }
          else {
            uVar20 = pTVar24->validity_mask[uVar14];
            pUVar12 = pUVar23 + 0x40;
            if (count <= pUVar23 + 0x40) {
              pUVar12 = count;
            }
            if (uVar20 == 0xffffffffffffffff) goto LAB_0072b619;
            pUVar15 = pUVar12;
            if (uVar20 != 0) {
              puVar18 = (uint64_t *)((long)pUVar23 * 0x10 + lVar17);
              for (uVar16 = 0; pUVar15 = pUVar23 + uVar16, pUVar15 < pUVar12; uVar16 = uVar16 + 1) {
                if ((uVar20 >> (uVar16 & 0x3f) & 1) != 0) {
                  fun_01.lhs_data = &lhs_data;
                  fun_01.func_name = (string *)psVar11;
                  fun_01.rhs_data = &rhs_data;
                  left_00.length = *puVar18;
                  left_00.offset = puVar18[-1];
                  dVar7 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                    (fun_01,left_00,*plVar4,(ValidityMask *)pTVar24,(idx_t)pUVar15);
                  *(double *)(lVar5 + (long)pUVar23 * 8 + uVar16 * 8) = dVar7;
                }
                puVar18 = puVar18 + 2;
              }
            }
          }
          pUVar23 = pUVar15;
        }
      }
      goto LAB_0072bb72;
    }
    duckdb::Vector::SetVectorType(VVar19);
  }
  else {
    if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
      if (vVar2 == (value_type)0x0 && vVar1 == (value_type)0x0) {
        lVar17 = *(long *)(vector + 0x20);
        lVar5 = *(long *)(vector_00 + 0x20);
        duckdb::Vector::SetVectorType(VVar19);
        lVar6 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        pTVar24 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
        FlatVector::VerifyFlatVector(vector);
        TemplatedValidityMask<unsigned_long>::Copy
                  (pTVar24,(TemplatedValidityMask<unsigned_long> *)(vector + 0x28),(idx_t)count);
        lVar22 = *(long *)(result + 0x28);
        FlatVector::VerifyFlatVector(vector_00);
        if (lVar22 == 0) {
          TemplatedValidityMask<unsigned_long>::Copy
                    (pTVar24,(TemplatedValidityMask<unsigned_long> *)(vector_00 + 0x28),(idx_t)count
                    );
        }
        else {
          duckdb::ValidityMask::Combine((ValidityMask *)pTVar24,(ulong)(vector_00 + 0x28));
        }
        lVar22 = 1;
        if (pTVar24->validity_mask == (unsigned_long *)0x0) {
          for (pUVar23 = (UnifiedVectorFormat *)0x0; count != pUVar23; pUVar23 = pUVar23 + 1) {
            fun_10.lhs_data = &lhs_data;
            fun_10.func_name = (string *)psVar11;
            fun_10.rhs_data = &rhs_data;
            right_06.length = *(uint64_t *)(lVar5 + lVar22 * 8);
            right_06.offset = *(uint64_t *)(lVar5 + -8 + lVar22 * 8);
            left_06.length = *(uint64_t *)(lVar17 + lVar22 * 8);
            left_06.offset = *(uint64_t *)(lVar17 + -8 + lVar22 * 8);
            dVar7 = BinaryLambdaWrapperWithNulls::
                    Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                              (fun_10,left_06,right_06,(ValidityMask *)pTVar24,(idx_t)pUVar23);
            *(double *)(lVar6 + (long)pUVar23 * 8) = dVar7;
            lVar22 = lVar22 + 2;
          }
        }
        else {
          pUVar23 = (UnifiedVectorFormat *)0x0;
          for (uVar14 = 0; uVar14 != (ulong)(count + 0x3f) >> 6; uVar14 = uVar14 + 1) {
            if (pTVar24->validity_mask == (unsigned_long *)0x0) {
              pUVar12 = pUVar23 + 0x40;
              if (count <= pUVar23 + 0x40) {
                pUVar12 = count;
              }
LAB_0072bc7b:
              uVar20 = (long)pUVar23 << 4 | 8;
              for (; pUVar15 = pUVar23, pUVar23 < pUVar12; pUVar23 = pUVar23 + 1) {
                fun_08.lhs_data = &lhs_data;
                fun_08.func_name = (string *)psVar11;
                fun_08.rhs_data = &rhs_data;
                right_04.length = *(uint64_t *)(lVar5 + uVar20);
                right_04.offset = *(uint64_t *)(lVar5 + -8 + uVar20);
                left_04.length = *(uint64_t *)(lVar17 + uVar20);
                left_04.offset = *(uint64_t *)(lVar17 + -8 + uVar20);
                dVar7 = BinaryLambdaWrapperWithNulls::
                        Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                  (fun_08,left_04,right_04,(ValidityMask *)pTVar24,(idx_t)pUVar23);
                *(double *)(lVar6 + (long)pUVar23 * 8) = dVar7;
                uVar20 = uVar20 + 0x10;
              }
            }
            else {
              uVar20 = pTVar24->validity_mask[uVar14];
              pUVar12 = pUVar23 + 0x40;
              if (count <= pUVar23 + 0x40) {
                pUVar12 = count;
              }
              if (uVar20 == 0xffffffffffffffff) goto LAB_0072bc7b;
              pUVar15 = pUVar12;
              if (uVar20 != 0) {
                uVar16 = (long)pUVar23 << 4 | 8;
                for (uVar21 = 0; pUVar15 = pUVar23 + uVar21, pUVar15 < pUVar12; uVar21 = uVar21 + 1)
                {
                  if ((uVar20 >> (uVar21 & 0x3f) & 1) != 0) {
                    fun_09.lhs_data = &lhs_data;
                    fun_09.func_name = (string *)psVar11;
                    fun_09.rhs_data = &rhs_data;
                    right_05.length = *(uint64_t *)(lVar5 + uVar16);
                    right_05.offset = *(uint64_t *)(lVar5 + -8 + uVar16);
                    left_05.length = *(uint64_t *)(lVar17 + uVar16);
                    left_05.offset = *(uint64_t *)(lVar17 + -8 + uVar16);
                    dVar7 = BinaryLambdaWrapperWithNulls::
                            Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                      (fun_09,left_05,right_05,(ValidityMask *)pTVar24,
                                       (idx_t)pUVar15);
                    *(double *)((long)pUVar23 * 8 + lVar6 + uVar21 * 8) = dVar7;
                  }
                  uVar16 = uVar16 + 0x10;
                }
              }
            }
            pUVar23 = pUVar15;
          }
        }
      }
      else {
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c8);
        duckdb::Vector::ToUnifiedFormat((ulong)vector,count);
        duckdb::Vector::ToUnifiedFormat((ulong)vector_00,count);
        duckdb::Vector::SetVectorType(VVar19);
        lVar17 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        pTVar24 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
        if (local_b8 == 0 && local_100[0]._M_allocated_capacity == 0) {
          for (pUVar23 = (UnifiedVectorFormat *)0x0; count != pUVar23; pUVar23 = pUVar23 + 1) {
            pUVar12 = pUVar23;
            if (*(long *)_ldata != 0) {
              pUVar12 = (UnifiedVectorFormat *)(ulong)*(uint *)(*(long *)_ldata + (long)pUVar23 * 4)
              ;
            }
            pUVar15 = pUVar23;
            if (*local_c8 != 0) {
              pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c8 + (long)pUVar23 * 4);
            }
            fun_02.lhs_data = &lhs_data;
            fun_02.func_name = (string *)psVar11;
            fun_02.rhs_data = &rhs_data;
            right.length = *(uint64_t *)(local_c0 + 8 + (long)pUVar15 * 0x10);
            right.offset = *(uint64_t *)(local_c0 + (long)pUVar15 * 0x10);
            left_01.length = *(uint64_t *)(local_108 + 8 + (long)pUVar12 * 0x10);
            left_01.offset = *(uint64_t *)(local_108 + (long)pUVar12 * 0x10);
            dVar7 = BinaryLambdaWrapperWithNulls::
                    Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                              (fun_02,left_01,right,(ValidityMask *)pTVar24,(idx_t)pUVar23);
            *(double *)(lVar17 + (long)pUVar23 * 8) = dVar7;
          }
        }
        else {
          for (pUVar23 = (UnifiedVectorFormat *)0x0; count != pUVar23; pUVar23 = pUVar23 + 1) {
            pUVar12 = pUVar23;
            if (*(long *)_ldata != 0) {
              pUVar12 = (UnifiedVectorFormat *)(ulong)*(uint *)(*(long *)_ldata + (long)pUVar23 * 4)
              ;
            }
            pUVar15 = pUVar23;
            if (*local_c8 != 0) {
              pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c8 + (long)pUVar23 * 4);
            }
            if (((local_100[0]._M_allocated_capacity == 0) ||
                ((*(ulong *)(local_100[0]._M_allocated_capacity + ((ulong)pUVar12 >> 6) * 8) >>
                  ((ulong)pUVar12 & 0x3f) & 1) != 0)) &&
               ((local_b8 == 0 ||
                ((*(ulong *)(local_b8 + ((ulong)pUVar15 >> 6) * 8) >> ((ulong)pUVar15 & 0x3f) & 1)
                 != 0)))) {
              fun_06.lhs_data = &lhs_data;
              fun_06.func_name = (string *)psVar11;
              fun_06.rhs_data = &rhs_data;
              right_02.length = *(uint64_t *)(local_c0 + 8 + (long)pUVar15 * 0x10);
              right_02.offset = *(uint64_t *)(local_c0 + (long)pUVar15 * 0x10);
              left_03.length = *(uint64_t *)(local_108 + 8 + (long)pUVar12 * 0x10);
              left_03.offset = *(uint64_t *)(local_108 + (long)pUVar12 * 0x10);
              dVar7 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                (fun_06,left_03,right_02,(ValidityMask *)pTVar24,(idx_t)pUVar23);
              *(double *)(lVar17 + (long)pUVar23 * 8) = dVar7;
            }
            else {
              TemplatedValidityMask<unsigned_long>::SetInvalid(pTVar24,(idx_t)pUVar23);
            }
          }
        }
        UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_c8);
        UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
      }
      goto LAB_0072bb72;
    }
    plVar4 = *(list_entry_t **)(vector + 0x20);
    lVar17 = *(long *)(vector_00 + 0x20);
    if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
      duckdb::Vector::SetVectorType(VVar19);
      lVar5 = *(long *)(result + 0x20);
      FlatVector::VerifyFlatVector(result);
      pTVar24 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
      FlatVector::VerifyFlatVector(vector_00);
      TemplatedValidityMask<unsigned_long>::Copy
                (pTVar24,(TemplatedValidityMask<unsigned_long> *)(vector_00 + 0x28),(idx_t)count);
      if (*(long *)(result + 0x28) == 0) {
        puVar18 = (uint64_t *)(lVar17 + 8);
        for (pUVar23 = (UnifiedVectorFormat *)0x0; count != pUVar23; pUVar23 = pUVar23 + 1) {
          fun_07.lhs_data = &lhs_data;
          fun_07.func_name = (string *)psVar11;
          fun_07.rhs_data = &rhs_data;
          right_03.length = *puVar18;
          right_03.offset = puVar18[-1];
          dVar7 = BinaryLambdaWrapperWithNulls::
                  Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                            (fun_07,*plVar4,right_03,(ValidityMask *)pTVar24,(idx_t)pUVar23);
          *(double *)(lVar5 + (long)pUVar23 * 8) = dVar7;
          puVar18 = puVar18 + 2;
        }
      }
      else {
        lVar17 = lVar17 + 8;
        pUVar23 = (UnifiedVectorFormat *)0x0;
        for (uVar14 = 0; uVar14 != (ulong)(count + 0x3f) >> 6; uVar14 = uVar14 + 1) {
          if (pTVar24->validity_mask == (unsigned_long *)0x0) {
            pUVar12 = pUVar23 + 0x40;
            if (count <= pUVar23 + 0x40) {
              pUVar12 = count;
            }
LAB_0072b8e0:
            puVar18 = (uint64_t *)((long)pUVar23 * 0x10 + lVar17);
            for (; pUVar15 = pUVar23, pUVar23 < pUVar12; pUVar23 = pUVar23 + 1) {
              fun_03.lhs_data = &lhs_data;
              fun_03.func_name = (string *)psVar11;
              fun_03.rhs_data = &rhs_data;
              right_00.length = *puVar18;
              right_00.offset = puVar18[-1];
              dVar7 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                (fun_03,*plVar4,right_00,(ValidityMask *)pTVar24,(idx_t)pUVar23);
              *(double *)(lVar5 + (long)pUVar23 * 8) = dVar7;
              puVar18 = puVar18 + 2;
            }
          }
          else {
            uVar20 = pTVar24->validity_mask[uVar14];
            pUVar12 = pUVar23 + 0x40;
            if (count <= pUVar23 + 0x40) {
              pUVar12 = count;
            }
            if (uVar20 == 0xffffffffffffffff) goto LAB_0072b8e0;
            pUVar15 = pUVar12;
            if (uVar20 != 0) {
              puVar18 = (uint64_t *)((long)pUVar23 * 0x10 + lVar17);
              for (uVar16 = 0; pUVar15 = pUVar23 + uVar16, pUVar15 < pUVar12; uVar16 = uVar16 + 1) {
                if ((uVar20 >> (uVar16 & 0x3f) & 1) != 0) {
                  fun_04.lhs_data = &lhs_data;
                  fun_04.func_name = (string *)psVar11;
                  fun_04.rhs_data = &rhs_data;
                  right_01.length = *puVar18;
                  right_01.offset = puVar18[-1];
                  dVar7 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                    (fun_04,*plVar4,right_01,(ValidityMask *)pTVar24,(idx_t)pUVar15)
                  ;
                  *(double *)(lVar5 + (long)pUVar23 * 8 + uVar16 * 8) = dVar7;
                }
                puVar18 = puVar18 + 2;
              }
            }
          }
          pUVar23 = pUVar15;
        }
      }
      goto LAB_0072bb72;
    }
    duckdb::Vector::SetVectorType(VVar19);
  }
  duckdb::ConstantVector::SetNull(result,true);
LAB_0072bb72:
  cVar9 = duckdb::DataChunk::AllConstant();
  if (cVar9 != '\0') {
    duckdb::Vector::SetVectorType(VVar19);
  }
  return;
}

Assistant:

static void ListGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	auto count = args.size();

	auto &lhs_vec = args.data[0];
	auto &rhs_vec = args.data[1];

	const auto lhs_count = ListVector::GetListSize(lhs_vec);
	const auto rhs_count = ListVector::GetListSize(rhs_vec);

	auto &lhs_child = ListVector::GetEntry(lhs_vec);
	auto &rhs_child = ListVector::GetEntry(rhs_vec);

	lhs_child.Flatten(lhs_count);
	rhs_child.Flatten(rhs_count);

	D_ASSERT(lhs_child.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rhs_child.GetVectorType() == VectorType::FLAT_VECTOR);

	if (!FlatVector::Validity(lhs_child).CheckAllValid(lhs_count)) {
		throw InvalidInputException("%s: left argument can not contain NULL values", func_name);
	}

	if (!FlatVector::Validity(rhs_child).CheckAllValid(rhs_count)) {
		throw InvalidInputException("%s: right argument can not contain NULL values", func_name);
	}

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);

	BinaryExecutor::ExecuteWithNulls<list_entry_t, list_entry_t, TYPE>(
	    lhs_vec, rhs_vec, result, count,
	    [&](const list_entry_t &left, const list_entry_t &right, ValidityMask &mask, idx_t row_idx) {
		    if (left.length != right.length) {
			    throw InvalidInputException(
			        "%s: list dimensions must be equal, got left length '%d' and right length '%d'", func_name,
			        left.length, right.length);
		    }

		    if (!OP::ALLOW_EMPTY && left.length == 0) {
			    mask.SetInvalid(row_idx);
			    return TYPE();
		    }

		    return OP::Operation(lhs_data + left.offset, rhs_data + right.offset, left.length);
	    });

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}